

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AcceptanceTests_Load_Test>::
~ParameterizedTestFactory
          (ParameterizedTestFactory<(anonymous_namespace)::AcceptanceTests_Load_Test> *this)

{
  ParameterizedTestFactory<(anonymous_namespace)::AcceptanceTests_Load_Test> *this_local;
  
  ~ParameterizedTestFactory(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter) :
      parameter_(parameter) {}